

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interpreter.cpp
# Opt level: O3

Value * __thiscall
ot::commissioner::Interpreter::ProcessStart
          (Value *__return_storage_ptr__,Interpreter *this,Expression *aExpr)

{
  string *this_00;
  string *this_01;
  pointer pbVar1;
  char cVar2;
  ErrorCode EVar3;
  pointer pcVar4;
  pointer pbVar5;
  undefined4 uVar6;
  Status SVar7;
  long lVar8;
  char *pcVar9;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar10;
  Value *pVVar11;
  undefined1 *puVar12;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v10::basic_format_context<fmt::v10::appender,_char>_>_2
  in_R9;
  uint __len;
  undefined1 *puVar13;
  char *pcVar14;
  string_view fmt;
  string_view fmt_00;
  format_args args;
  format_args args_00;
  format_args args_01;
  format_args args_02;
  format_args args_03;
  BorderRouterId rawid;
  string __str;
  writer write;
  Expression expr;
  CommissionerAppPtr commissioner;
  NetworkSelectionComparator guard;
  BorderRouter br;
  BorderRouterId local_434;
  undefined1 local_430 [8];
  _Alloc_hider local_428;
  char local_420 [8];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_418;
  _Alloc_hider local_408;
  size_type local_400;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_3f8;
  string local_3e8;
  writer local_3c8;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_3c0;
  CommissionerAppPtr local_3a8;
  NetworkSelectionComparator local_390;
  format_string_checker<char> local_378;
  undefined4 local_348;
  undefined1 *local_340;
  long local_338;
  undefined1 local_330 [16];
  undefined4 local_320;
  undefined1 *local_318;
  long local_310;
  undefined1 local_308 [16];
  undefined4 local_2f8;
  undefined1 *local_2f0;
  long local_2e8;
  undefined1 local_2e0 [16];
  undefined4 local_2d0;
  undefined1 *local_2c8;
  long local_2c0;
  undefined1 local_2b8 [16];
  undefined4 local_2a8;
  undefined1 *local_2a0;
  long local_298;
  undefined1 local_290 [16];
  Error local_280;
  Error local_258;
  Error local_230;
  Error local_208;
  Error local_1e0;
  BorderRouter local_1b8;
  
  (__return_storage_ptr__->mError).mCode = kNone;
  (__return_storage_ptr__->mError).mMessage._M_dataplus._M_p =
       (pointer)&(__return_storage_ptr__->mError).mMessage.field_2;
  (__return_storage_ptr__->mError).mMessage._M_string_length = 0;
  (__return_storage_ptr__->mError).mMessage.field_2._M_local_buf[0] = '\0';
  (__return_storage_ptr__->mData)._M_dataplus._M_p =
       (pointer)&(__return_storage_ptr__->mData).field_2;
  (__return_storage_ptr__->mData)._M_string_length = 0;
  (__return_storage_ptr__->mData).field_2._M_local_buf[0] = '\0';
  local_3a8.super___shared_ptr<ot::commissioner::CommissionerApp,_(__gnu_cxx::_Lock_policy)2>._M_ptr
       = (element_type *)0x0;
  local_3a8.super___shared_ptr<ot::commissioner::CommissionerApp,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&local_3c0,aExpr);
  persistent_storage::BorderRouter::BorderRouter(&local_1b8);
  this_00 = &(__return_storage_ptr__->mError).mMessage;
  this_01 = &__return_storage_ptr__->mData;
  lVar8 = (long)(aExpr->
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                )._M_impl.super__Vector_impl_data._M_finish -
          (long)(aExpr->
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                )._M_impl.super__Vector_impl_data._M_start >> 5;
  if (lVar8 == 1) {
    SVar7 = persistent_storage::Registry::GetCurrentNetworkXpan
                      ((this->mRegistry).
                       super___shared_ptr<ot::commissioner::persistent_storage::Registry,_(__gnu_cxx::_Lock_policy)2>
                       ._M_ptr,(uint64_t *)&local_390);
    if (SVar7 == kSuccess) {
      JobManager::GetSelectedCommissioner
                (&local_1e0,
                 (this->mJobManager).
                 super___shared_ptr<ot::commissioner::JobManager,_(__gnu_cxx::_Lock_policy)2>._M_ptr
                 ,&local_3a8);
      local_430._0_4_ = local_1e0.mCode;
      local_428._M_p = (pointer)&local_418;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_428,local_1e0.mMessage._M_dataplus._M_p,
                 local_1e0.mMessage._M_dataplus._M_p + local_1e0.mMessage._M_string_length);
      local_400 = 0;
      local_3f8._M_local_buf[0] = '\0';
      (__return_storage_ptr__->mError).mCode = local_430._0_4_;
      local_408._M_p = (pointer)&local_3f8;
      std::__cxx11::string::operator=((string *)this_00,(string *)&local_428);
      std::__cxx11::string::operator=((string *)this_01,(string *)&local_408);
      EVar3 = (__return_storage_ptr__->mError).mCode;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_408._M_p != &local_3f8) {
        operator_delete(local_408._M_p);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_428._M_p != &local_418) {
        operator_delete(local_428._M_p);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1e0.mMessage._M_dataplus._M_p != &local_1e0.mMessage.field_2) {
        operator_delete(local_1e0.mMessage._M_dataplus._M_p);
      }
      if (EVar3 != kNone) goto LAB_0011a924;
      JobManager::MakeBorderRouterChoice
                (&local_208,
                 (this->mJobManager).
                 super___shared_ptr<ot::commissioner::JobManager,_(__gnu_cxx::_Lock_policy)2>._M_ptr
                 ,(uint64_t)local_390.mInterpreter,&local_1b8);
      local_430._0_4_ = local_208.mCode;
      local_428._M_p = (pointer)&local_418;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_428,local_208.mMessage._M_dataplus._M_p,
                 local_208.mMessage._M_dataplus._M_p + local_208.mMessage._M_string_length);
      local_400 = 0;
      local_3f8._M_local_buf[0] = '\0';
      (__return_storage_ptr__->mError).mCode = local_430._0_4_;
      local_408._M_p = (pointer)&local_3f8;
      std::__cxx11::string::operator=((string *)this_00,(string *)&local_428);
      std::__cxx11::string::operator=((string *)this_01,(string *)&local_408);
      EVar3 = (__return_storage_ptr__->mError).mCode;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_408._M_p != &local_3f8) {
        operator_delete(local_408._M_p);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_428._M_p != &local_418) {
        operator_delete(local_428._M_p);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_208.mMessage._M_dataplus._M_p != &local_208.mMessage.field_2) {
        operator_delete(local_208.mMessage._M_dataplus._M_p);
      }
      if (EVar3 != kNone) goto LAB_0011a924;
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back(&local_3c0,&local_1b8.mAgent.mAddr);
      __len = 1;
      if (((9 < local_1b8.mAgent.mPort) && (__len = 2, 99 < local_1b8.mAgent.mPort)) &&
         (__len = 3, 999 < local_1b8.mAgent.mPort)) {
        __len = 5 - (local_1b8.mAgent.mPort < 10000);
      }
      local_430 = (undefined1  [8])local_420;
      std::__cxx11::string::_M_construct((ulong)local_430,(char)__len);
      std::__detail::__to_chars_10_impl<unsigned_int>
                ((char *)local_430,__len,(uint)local_1b8.mAgent.mPort);
      std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      emplace_back<std::__cxx11::string>
                ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&local_3c0,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_430);
      if (local_430 != (undefined1  [8])local_420) {
        operator_delete((void *)local_430);
      }
LAB_0011a634:
      ProcessStartJob((Value *)local_430,this,&local_3a8,&local_3c0);
      (__return_storage_ptr__->mError).mCode = local_430._0_4_;
      std::__cxx11::string::operator=((string *)this_00,(string *)&local_428);
      std::__cxx11::string::operator=((string *)this_01,(string *)&local_408);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_408._M_p != &local_3f8) {
        operator_delete(local_408._M_p);
      }
      paVar10 = &local_418;
    }
    else {
      local_378._0_8_ = local_378._0_8_ & 0xffffffff00000000;
      local_378.context_.super_basic_format_parse_context<char>.format_str_.data_ =
           "getting selected network failed";
      local_378.context_.super_basic_format_parse_context<char>.format_str_.size_ = 0x1f;
      local_378.context_.super_basic_format_parse_context<char>.next_arg_id_ = 0;
      local_378.context_.super_basic_format_parse_context<char>._20_4_ = 0;
      local_378.parse_funcs_[0] = (parse_func)0x0;
      pcVar9 = "getting selected network failed";
      local_378.context_.types_ = local_378.types_;
      do {
        pcVar14 = pcVar9 + 1;
        if (*pcVar9 == '}') {
          if ((pcVar14 == "") || (*pcVar14 != '}')) {
            ::fmt::v10::detail::throw_format_error("unmatched \'}\' in format string");
          }
          pcVar14 = pcVar9 + 2;
        }
        else if (*pcVar9 == '{') {
          pcVar14 = ::fmt::v10::detail::
                    parse_replacement_field<char,fmt::v10::detail::format_string_checker<char>&>
                              (pcVar9,"",&local_378);
        }
        pcVar9 = pcVar14;
      } while (pcVar14 != "");
      args_00.field_1.args_ = in_R9.args_;
      args_00.desc_ = (unsigned_long_long)&local_378;
      ::fmt::v10::vformat_abi_cxx11_
                (&local_3e8,(v10 *)"getting selected network failed",(string_view)ZEXT816(0x1f),
                 args_00);
      local_2a8 = 0x12;
      puVar13 = local_290;
      local_2a0 = puVar13;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_2a0,local_3e8._M_dataplus._M_p,
                 local_3e8._M_dataplus._M_p + local_3e8._M_string_length);
      local_430._0_4_ = local_2a8;
      local_428._M_p = (pointer)&local_418;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_428,local_2a0,local_2a0 + local_298);
      local_400 = 0;
      local_3f8._M_local_buf[0] = '\0';
      (__return_storage_ptr__->mError).mCode = local_430._0_4_;
      local_408._M_p = (pointer)&local_3f8;
      std::__cxx11::string::operator=((string *)this_00,(string *)&local_428);
      std::__cxx11::string::operator=((string *)this_01,(string *)&local_408);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_408._M_p != &local_3f8) {
        operator_delete(local_408._M_p);
      }
      puVar12 = local_2a0;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_428._M_p != &local_418) {
        operator_delete(local_428._M_p);
        puVar12 = local_2a0;
      }
LAB_0011a1c9:
      if (puVar12 != puVar13) {
        operator_delete(puVar12);
      }
      paVar10 = &local_3e8.field_2;
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*(undefined1 **)(paVar10->_M_local_buf + -0x10) != paVar10) {
      operator_delete(*(undefined1 **)(paVar10->_M_local_buf + -0x10));
    }
    goto LAB_0011a924;
  }
  if (lVar8 == 2) {
    persistent_storage::BorderRouterId::BorderRouterId(&local_434);
    NetworkSelectionComparator::NetworkSelectionComparator(&local_390,this);
    utils::ParseInteger<unsigned_int>
              (&local_230,&local_434.mId,
               local_3c0.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start + 1);
    local_430._0_4_ = local_230.mCode;
    local_428._M_p = (pointer)&local_418;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_428,local_230.mMessage._M_dataplus._M_p,
               local_230.mMessage._M_dataplus._M_p + local_230.mMessage._M_string_length);
    local_400 = 0;
    local_3f8._M_local_buf[0] = '\0';
    (__return_storage_ptr__->mError).mCode = local_430._0_4_;
    local_408._M_p = (pointer)&local_3f8;
    std::__cxx11::string::operator=((string *)this_00,(string *)&local_428);
    std::__cxx11::string::operator=((string *)this_01,(string *)&local_408);
    EVar3 = (__return_storage_ptr__->mError).mCode;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_408._M_p != &local_3f8) {
      operator_delete(local_408._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_428._M_p != &local_418) {
      operator_delete(local_428._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_230.mMessage._M_dataplus._M_p != &local_230.mMessage.field_2) {
      operator_delete(local_230.mMessage._M_dataplus._M_p);
    }
    if (EVar3 == kNone) {
      SVar7 = persistent_storage::Registry::GetBorderRouter
                        ((this->mRegistry).
                         super___shared_ptr<ot::commissioner::persistent_storage::Registry,_(__gnu_cxx::_Lock_policy)2>
                         ._M_ptr,local_434,&local_1b8);
      if (SVar7 == kSuccess) {
        SVar7 = persistent_storage::Registry::SetCurrentNetwork
                          ((this->mRegistry).
                           super___shared_ptr<ot::commissioner::persistent_storage::Registry,_(__gnu_cxx::_Lock_policy)2>
                           ._M_ptr,&local_1b8);
        if (SVar7 == kSuccess) {
          UpdateNetworkSelectionInfo((Error *)local_430,this,false);
          uVar6 = local_430._0_4_;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_428._M_p != &local_418) {
            operator_delete(local_428._M_p);
          }
          if (uVar6 == kNone) {
            JobManager::GetSelectedCommissioner
                      (&local_258,
                       (this->mJobManager).
                       super___shared_ptr<ot::commissioner::JobManager,_(__gnu_cxx::_Lock_policy)2>.
                       _M_ptr,&local_3a8);
            local_430._0_4_ = local_258.mCode;
            local_428._M_p = (pointer)&local_418;
            std::__cxx11::string::_M_construct<char*>
                      ((string *)&local_428,local_258.mMessage._M_dataplus._M_p,
                       local_258.mMessage._M_dataplus._M_p + local_258.mMessage._M_string_length);
            local_400 = 0;
            local_3f8._M_local_buf[0] = '\0';
            local_408._M_p = (pointer)&local_3f8;
            pVVar11 = Value::operator=(__return_storage_ptr__,(Value *)local_430);
            EVar3 = (pVVar11->mError).mCode;
            Value::~Value((Value *)local_430);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_258.mMessage._M_dataplus._M_p != &local_258.mMessage.field_2) {
              operator_delete(local_258.mMessage._M_dataplus._M_p);
            }
            if (EVar3 == kNone) {
              pbVar1 = local_3c0.
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_finish + -1;
              pcVar4 = local_3c0.
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_finish[-1]._M_dataplus._M_p;
              pbVar5 = local_3c0.
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_finish + -1;
              local_3c0.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_finish = pbVar1;
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)pcVar4 != &pbVar5->field_2) {
                operator_delete(pcVar4);
              }
              std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::push_back(&local_3c0,&local_1b8.mAgent.mAddr);
              std::__cxx11::to_string((string *)local_430,(uint)local_1b8.mAgent.mPort);
              std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
              emplace_back<std::__cxx11::string>
                        ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                         &local_3c0,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_430);
              if (local_430 != (undefined1  [8])local_420) {
                operator_delete((void *)local_430);
              }
              goto LAB_0011a627;
            }
          }
          goto LAB_0011a917;
        }
        local_378.types_[0] = uint_type;
        pcVar9 = "network selection failed for nwk[{}]";
        local_378.context_.super_basic_format_parse_context<char>.format_str_.data_ =
             "network selection failed for nwk[{}]";
        local_378.context_.super_basic_format_parse_context<char>.format_str_.size_ = 0x24;
        local_378.context_.super_basic_format_parse_context<char>.next_arg_id_ = 0;
        local_378.context_.super_basic_format_parse_context<char>._20_4_ = 1;
        local_378.parse_funcs_[0] =
             ::fmt::v10::detail::
             parse_format_specs<unsigned_int,fmt::v10::detail::compile_parse_context<char>>;
        local_3c8.handler_ = &local_378;
        local_378.context_.types_ = local_378.types_;
        do {
          cVar2 = *pcVar9;
          pcVar14 = pcVar9;
          while (cVar2 != '{') {
            pcVar14 = pcVar14 + 1;
            if (pcVar14 == "") {
              ::fmt::v10::detail::
              parse_format_string<true,_char,_fmt::v10::detail::format_string_checker<char,_unsigned_int>_>
              ::writer::operator()((writer *)&local_3c8,pcVar9,"");
              goto LAB_0011a75d;
            }
            cVar2 = *pcVar14;
          }
          ::fmt::v10::detail::
          parse_format_string<true,_char,_fmt::v10::detail::format_string_checker<char,_unsigned_int>_>
          ::writer::operator()((writer *)&local_3c8,pcVar9,pcVar14);
          pcVar9 = ::fmt::v10::detail::
                   parse_replacement_field<char,fmt::v10::detail::format_string_checker<char,unsigned_int>&>
                             (pcVar14,"",&local_378);
        } while (pcVar9 != "");
LAB_0011a75d:
        local_378._0_8_ = ZEXT48(local_1b8.mNetworkId.mId);
        fmt_00.size_ = 2;
        fmt_00.data_ = (char *)0x24;
        args_03.field_1.args_ = in_R9.args_;
        args_03.desc_ = (unsigned_long_long)&local_378;
        ::fmt::v10::vformat_abi_cxx11_
                  (&local_3e8,(v10 *)"network selection failed for nwk[{}]",fmt_00,args_03);
        local_2f8 = 5;
        puVar13 = local_2e0;
        local_2f0 = puVar13;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_2f0,local_3e8._M_dataplus._M_p,
                   local_3e8._M_dataplus._M_p + local_3e8._M_string_length);
        local_430._0_4_ = local_2f8;
        local_428._M_p = (pointer)&local_418;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_428,local_2f0,local_2f0 + local_2e8);
        local_400 = 0;
        local_3f8._M_local_buf[0] = '\0';
        (__return_storage_ptr__->mError).mCode = local_430._0_4_;
        local_408._M_p = (pointer)&local_3f8;
        std::__cxx11::string::operator=((string *)this_00,(string *)&local_428);
        std::__cxx11::string::operator=((string *)this_01,(string *)&local_408);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_408._M_p != &local_3f8) {
          operator_delete(local_408._M_p);
        }
        puVar12 = local_2f0;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_428._M_p != &local_418) {
          operator_delete(local_428._M_p);
          puVar12 = local_2f0;
        }
      }
      else {
        local_378.types_[0] = uint_type;
        local_378.context_.super_basic_format_parse_context<char>.format_str_.data_ =
             "br[{}] not found";
        local_378.context_.super_basic_format_parse_context<char>.format_str_.size_ = 0x10;
        local_378.context_.super_basic_format_parse_context<char>.next_arg_id_ = 0;
        local_378.context_.super_basic_format_parse_context<char>._20_4_ = 1;
        local_378.parse_funcs_[0] =
             ::fmt::v10::detail::
             parse_format_specs<unsigned_int,fmt::v10::detail::compile_parse_context<char>>;
        pcVar9 = "br[{}] not found";
        local_378.context_.types_ = local_378.types_;
        do {
          pcVar14 = pcVar9 + 1;
          if (*pcVar9 == '}') {
            if ((pcVar14 == "") || (*pcVar14 != '}')) {
              ::fmt::v10::detail::throw_format_error("unmatched \'}\' in format string");
            }
            pcVar14 = pcVar9 + 2;
          }
          else if (*pcVar9 == '{') {
            pcVar14 = ::fmt::v10::detail::
                      parse_replacement_field<char,fmt::v10::detail::format_string_checker<char,unsigned_int>&>
                                (pcVar9,"",&local_378);
          }
          pcVar9 = pcVar14;
        } while (pcVar14 != "");
        local_378._0_8_ = ZEXT48(local_434.mId);
        fmt.size_ = 2;
        fmt.data_ = (char *)0x10;
        args.field_1.args_ = in_R9.args_;
        args.desc_ = (unsigned_long_long)&local_378;
        ::fmt::v10::vformat_abi_cxx11_(&local_3e8,(v10 *)"br[{}] not found",fmt,args);
        local_2d0 = 5;
        puVar13 = local_2b8;
        local_2c8 = puVar13;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_2c8,local_3e8._M_dataplus._M_p,
                   local_3e8._M_dataplus._M_p + local_3e8._M_string_length);
        local_430._0_4_ = local_2d0;
        local_428._M_p = (pointer)&local_418;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_428,local_2c8,local_2c8 + local_2c0);
        local_400 = 0;
        local_3f8._M_local_buf[0] = '\0';
        (__return_storage_ptr__->mError).mCode = local_430._0_4_;
        local_408._M_p = (pointer)&local_3f8;
        std::__cxx11::string::operator=((string *)this_00,(string *)&local_428);
        std::__cxx11::string::operator=((string *)this_01,(string *)&local_408);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_408._M_p != &local_3f8) {
          operator_delete(local_408._M_p);
        }
        puVar12 = local_2c8;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_428._M_p != &local_418) {
          operator_delete(local_428._M_p);
          puVar12 = local_2c8;
        }
      }
      if (puVar12 != puVar13) {
LAB_0011a2e9:
        operator_delete(puVar12);
      }
      goto LAB_0011a2ee;
    }
  }
  else {
    if (lVar8 != 3) {
      local_378._0_8_ = local_378._0_8_ & 0xffffffff00000000;
      local_378.context_.super_basic_format_parse_context<char>.format_str_.data_ =
           "too many arguments";
      local_378.context_.super_basic_format_parse_context<char>.format_str_.size_ = 0x12;
      local_378.context_.super_basic_format_parse_context<char>.next_arg_id_ = 0;
      local_378.context_.super_basic_format_parse_context<char>._20_4_ = 0;
      local_378.parse_funcs_[0] = (parse_func)0x0;
      pcVar9 = "too many arguments";
      local_378.context_.types_ = local_378.types_;
      do {
        pcVar14 = pcVar9 + 1;
        if (*pcVar9 == '}') {
          if ((pcVar14 == "") || (*pcVar14 != '}')) {
            ::fmt::v10::detail::throw_format_error("unmatched \'}\' in format string");
          }
          pcVar14 = pcVar9 + 2;
        }
        else if (*pcVar9 == '{') {
          pcVar14 = ::fmt::v10::detail::
                    parse_replacement_field<char,fmt::v10::detail::format_string_checker<char>&>
                              (pcVar9,"",&local_378);
        }
        pcVar9 = pcVar14;
      } while (pcVar14 != "");
      args_01.field_1.args_ = in_R9.args_;
      args_01.desc_ = (unsigned_long_long)&local_378;
      ::fmt::v10::vformat_abi_cxx11_
                (&local_3e8,(v10 *)"too many arguments",(string_view)ZEXT816(0x12),args_01);
      local_348 = 3;
      puVar13 = local_330;
      local_340 = puVar13;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_340,local_3e8._M_dataplus._M_p,
                 local_3e8._M_dataplus._M_p + local_3e8._M_string_length);
      local_430._0_4_ = local_348;
      local_428._M_p = (pointer)&local_418;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_428,local_340,local_340 + local_338);
      local_400 = 0;
      local_3f8._M_local_buf[0] = '\0';
      (__return_storage_ptr__->mError).mCode = local_430._0_4_;
      local_408._M_p = (pointer)&local_3f8;
      std::__cxx11::string::operator=((string *)this_00,(string *)&local_428);
      std::__cxx11::string::operator=((string *)this_01,(string *)&local_408);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_408._M_p != &local_3f8) {
        operator_delete(local_408._M_p);
      }
      puVar12 = local_340;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_428._M_p != &local_418) {
        operator_delete(local_428._M_p);
        puVar12 = local_340;
      }
      goto LAB_0011a1c9;
    }
    NetworkSelectionComparator::NetworkSelectionComparator(&local_390,this);
    SVar7 = persistent_storage::Registry::ForgetCurrentNetwork
                      ((this->mRegistry).
                       super___shared_ptr<ot::commissioner::persistent_storage::Registry,_(__gnu_cxx::_Lock_policy)2>
                       ._M_ptr);
    if (SVar7 == kSuccess) {
      UpdateNetworkSelectionInfo((Error *)local_430,this,false);
      uVar6 = local_430._0_4_;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_428._M_p != &local_418) {
        operator_delete(local_428._M_p);
      }
      if (uVar6 == kNone) {
        JobManager::GetSelectedCommissioner
                  (&local_280,
                   (this->mJobManager).
                   super___shared_ptr<ot::commissioner::JobManager,_(__gnu_cxx::_Lock_policy)2>.
                   _M_ptr,&local_3a8);
        local_430._0_4_ = local_280.mCode;
        local_428._M_p = (pointer)&local_418;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_428,local_280.mMessage._M_dataplus._M_p,
                   local_280.mMessage._M_dataplus._M_p + local_280.mMessage._M_string_length);
        local_400 = 0;
        local_3f8._M_local_buf[0] = '\0';
        (__return_storage_ptr__->mError).mCode = local_430._0_4_;
        local_408._M_p = (pointer)&local_3f8;
        std::__cxx11::string::operator=((string *)this_00,(string *)&local_428);
        std::__cxx11::string::operator=((string *)this_01,(string *)&local_408);
        EVar3 = (__return_storage_ptr__->mError).mCode;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_408._M_p != &local_3f8) {
          operator_delete(local_408._M_p);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_428._M_p != &local_418) {
          operator_delete(local_428._M_p);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_280.mMessage._M_dataplus._M_p != &local_280.mMessage.field_2) {
          operator_delete(local_280.mMessage._M_dataplus._M_p);
        }
        if (EVar3 == kNone) {
LAB_0011a627:
          NetworkSelectionComparator::~NetworkSelectionComparator(&local_390);
          goto LAB_0011a634;
        }
      }
      goto LAB_0011a917;
    }
    local_378._0_8_ = local_378._0_8_ & 0xffffffff00000000;
    pcVar9 = "failed to drop network selection";
    local_378.context_.super_basic_format_parse_context<char>.format_str_.data_ =
         "failed to drop network selection";
    local_378.context_.super_basic_format_parse_context<char>.format_str_.size_ = 0x20;
    local_378.context_.super_basic_format_parse_context<char>.next_arg_id_ = 0;
    local_378.context_.super_basic_format_parse_context<char>._20_4_ = 0;
    local_378.parse_funcs_[0] = (parse_func)0x0;
    local_3c8.handler_ = &local_378;
    local_378.context_.types_ = local_378.types_;
    do {
      cVar2 = *pcVar9;
      pcVar14 = pcVar9;
      while (cVar2 != '{') {
        pcVar14 = pcVar14 + 1;
        if (pcVar14 == "") {
          ::fmt::v10::detail::
          parse_format_string<true,_char,_fmt::v10::detail::format_string_checker<char>_>::writer::
          operator()(&local_3c8,pcVar9,"");
          goto LAB_0011a206;
        }
        cVar2 = *pcVar14;
      }
      ::fmt::v10::detail::
      parse_format_string<true,_char,_fmt::v10::detail::format_string_checker<char>_>::writer::
      operator()(&local_3c8,pcVar9,pcVar14);
      pcVar9 = ::fmt::v10::detail::
               parse_replacement_field<char,fmt::v10::detail::format_string_checker<char>&>
                         (pcVar14,"",&local_378);
    } while (pcVar9 != "");
LAB_0011a206:
    args_02.field_1.args_ = in_R9.args_;
    args_02.desc_ = (unsigned_long_long)&local_378;
    ::fmt::v10::vformat_abi_cxx11_
              (&local_3e8,(v10 *)"failed to drop network selection",(string_view)ZEXT816(0x20),
               args_02);
    local_320 = 0x12;
    local_318 = local_308;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_318,local_3e8._M_dataplus._M_p,
               local_3e8._M_dataplus._M_p + local_3e8._M_string_length);
    local_430._0_4_ = local_320;
    local_428._M_p = (pointer)&local_418;
    std::__cxx11::string::_M_construct<char*>((string *)&local_428,local_318,local_318 + local_310);
    local_400 = 0;
    local_3f8._M_local_buf[0] = '\0';
    (__return_storage_ptr__->mError).mCode = local_430._0_4_;
    local_408._M_p = (pointer)&local_3f8;
    std::__cxx11::string::operator=((string *)this_00,(string *)&local_428);
    std::__cxx11::string::operator=((string *)this_01,(string *)&local_408);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_408._M_p != &local_3f8) {
      operator_delete(local_408._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_428._M_p != &local_418) {
      operator_delete(local_428._M_p);
    }
    puVar12 = local_318;
    if (local_318 != local_308) goto LAB_0011a2e9;
LAB_0011a2ee:
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_3e8._M_dataplus._M_p != &local_3e8.field_2) {
      operator_delete(local_3e8._M_dataplus._M_p);
    }
  }
LAB_0011a917:
  NetworkSelectionComparator::~NetworkSelectionComparator(&local_390);
LAB_0011a924:
  local_1b8._vptr_BorderRouter = (_func_int **)&PTR__BorderRouter_00288f00;
  BorderAgent::~BorderAgent(&local_1b8.mAgent);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_3c0);
  if (local_3a8.super___shared_ptr<ot::commissioner::CommissionerApp,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_3a8.
               super___shared_ptr<ot::commissioner::CommissionerApp,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  return __return_storage_ptr__;
}

Assistant:

Interpreter::Value Interpreter::ProcessStart(const Expression &aExpr)
{
    Value              value;
    CommissionerAppPtr commissioner = nullptr;
    Expression         expr         = aExpr;
    BorderRouter       br;

    switch (aExpr.size())
    {
    case 1:
    {
        // starting currently selected network
        uint64_t       nid;
        RegistryStatus status = mRegistry->GetCurrentNetworkXpan(nid);
        VerifyOrExit(status == RegistryStatus::kSuccess,
                     value = ERROR_REGISTRY_ERROR("getting selected network failed"));
        SuccessOrExit(value = mJobManager->GetSelectedCommissioner(commissioner));
        SuccessOrExit(value = mJobManager->MakeBorderRouterChoice(nid, br));
        expr.push_back(br.mAgent.mAddr);
        expr.push_back(std::to_string(br.mAgent.mPort));
        break;
    }
    case 2:
    {
        // starting newtork by br raw id (experimental, for dev tests only)
        persistent_storage::BorderRouterId rawid;
        NetworkSelectionComparator         guard(*this);

        SuccessOrExit(value = ParseInteger(rawid.mId, expr[1]));
        VerifyOrExit(mRegistry->GetBorderRouter(rawid, br) == RegistryStatus::kSuccess,
                     value = ERROR_NOT_FOUND("br[{}] not found", rawid.mId));
        VerifyOrExit(mRegistry->SetCurrentNetwork(br) == RegistryStatus::kSuccess,
                     value = ERROR_NOT_FOUND("network selection failed for nwk[{}]", br.mNetworkId.mId));
        SuccessOrExit(UpdateNetworkSelectionInfo());
        SuccessOrExit(value = mJobManager->GetSelectedCommissioner(commissioner));
        expr.pop_back();
        expr.push_back(br.mAgent.mAddr);
        expr.push_back(std::to_string(br.mAgent.mPort));
        break;
    }
    case 3:
    {
        NetworkSelectionComparator guard(*this);

        // starting network with explicit br_addr and br_port
        VerifyOrExit(mRegistry->ForgetCurrentNetwork() == RegistryStatus::kSuccess,
                     value = ERROR_REGISTRY_ERROR("failed to drop network selection"));
        SuccessOrExit(UpdateNetworkSelectionInfo());
        SuccessOrExit(value = mJobManager->GetSelectedCommissioner(commissioner));
        break;
    }
    default:
        ExitNow(value = ERROR_INVALID_COMMAND(SYNTAX_MANY_ARGS));
    }

    value = ProcessStartJob(commissioner, expr);
exit:
    return value;
}